

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O1

void __thiscall
btDbvtBroadphase::performDeferredRemoval(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  btBroadphasePair *pbVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  btBroadphasePair *pbVar10;
  btDbvtProxy *pb;
  int iVar11;
  btAlignedObjectArray<btBroadphasePair> *pbVar12;
  int iVar13;
  undefined8 *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  btDbvtProxy *pa;
  btBroadphasePairSortPredicate local_4a;
  btBroadphasePairSortPredicate local_49;
  btAlignedObjectArray<btBroadphasePair> *local_48;
  btDbvtBroadphase *local_40;
  btDispatcher *local_38;
  
  local_38 = dispatcher;
  iVar9 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((char)iVar9 != '\0') {
    iVar9 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [7])();
    local_48 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar9);
    if (1 < local_48->m_size) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (local_48,&local_49,0,local_48->m_size + -1);
    }
    iVar9 = local_48->m_size;
    pbVar12 = local_48;
    if (iVar9 < 1) {
      iVar11 = 0;
    }
    else {
      lVar16 = 0;
      lVar18 = 0;
      iVar11 = 0;
      lVar15 = 0;
      lVar17 = 0;
      local_40 = this;
      do {
        pbVar10 = pbVar12->m_data;
        lVar3 = *(long *)((long)&pbVar10->m_pProxy0 + lVar16);
        lVar4 = *(long *)((long)&pbVar10->m_pProxy1 + lVar16);
        if (lVar15 == lVar4 && lVar17 == lVar3) {
LAB_00136236:
          puVar14 = (undefined8 *)((long)&pbVar10->m_pProxy0 + lVar16);
          (*(local_40->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [8])(local_40->m_paircache,puVar14,local_38);
          iVar11 = iVar11 + 1;
          *puVar14 = 0;
          puVar14[1] = 0;
          pbVar12 = local_48;
        }
        else {
          pfVar5 = *(float **)(lVar3 + 0x40);
          pfVar6 = *(float **)(lVar4 + 0x40);
          if (((((pfVar6[4] < *pfVar5) || (pfVar5[4] < *pfVar6)) || (pfVar6[5] < pfVar5[1])) ||
              ((pfVar5[5] < pfVar6[1] || (pfVar6[6] < pfVar5[2])))) || (pfVar5[6] < pfVar6[2]))
          goto LAB_00136236;
        }
        lVar18 = lVar18 + 1;
        iVar9 = pbVar12->m_size;
        lVar16 = lVar16 + 0x20;
        lVar15 = lVar4;
        lVar17 = lVar3;
      } while (lVar18 < iVar9);
    }
    if (1 < iVar9) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (pbVar12,&local_4a,0,iVar9 + -1);
      pbVar12 = local_48;
    }
    iVar9 = pbVar12->m_size;
    lVar17 = (long)iVar11;
    lVar15 = iVar9 - lVar17;
    iVar13 = (int)lVar15;
    if ((iVar11 < 1) && (iVar11 < 0)) {
      if (pbVar12->m_capacity < iVar13) {
        if (iVar9 == iVar11) {
          pbVar10 = (btBroadphasePair *)0x0;
        }
        else {
          pbVar10 = (btBroadphasePair *)btAlignedAllocInternal(lVar15 * 0x20,0x10);
          pbVar12 = local_48;
        }
        iVar2 = pbVar12->m_size;
        if (0 < (long)iVar2) {
          lVar15 = 0;
          do {
            pbVar7 = pbVar12->m_data;
            puVar14 = (undefined8 *)((long)&pbVar7->m_pProxy0 + lVar15);
            uVar8 = puVar14[1];
            puVar1 = (undefined8 *)((long)&pbVar10->m_pProxy0 + lVar15);
            *puVar1 = *puVar14;
            puVar1[1] = uVar8;
            *(undefined8 *)((long)&pbVar10->m_algorithm + lVar15) =
                 *(undefined8 *)((long)&pbVar7->m_algorithm + lVar15);
            *(undefined8 *)((long)&pbVar10->field_3 + lVar15) =
                 *(undefined8 *)((long)&pbVar7->field_3 + lVar15);
            lVar15 = lVar15 + 0x20;
          } while ((long)iVar2 * 0x20 != lVar15);
        }
        if (pbVar12->m_data != (btBroadphasePair *)0x0) {
          if (pbVar12->m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar12->m_data);
            pbVar12 = local_48;
          }
          pbVar12->m_data = (btBroadphasePair *)0x0;
        }
        pbVar12->m_ownsMemory = true;
        pbVar12->m_data = pbVar10;
        pbVar12->m_capacity = iVar13;
      }
      if (iVar11 < 0) {
        lVar15 = (long)iVar9 << 5;
        do {
          pbVar10 = pbVar12->m_data;
          puVar14 = (undefined8 *)((long)&pbVar10->m_algorithm + lVar15);
          *puVar14 = 0;
          puVar14[1] = 0;
          puVar14 = (undefined8 *)((long)&pbVar10->m_pProxy0 + lVar15);
          *puVar14 = 0;
          puVar14[1] = 0;
          lVar15 = lVar15 + 0x20;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0);
      }
    }
    pbVar12->m_size = iVar13;
  }
  return;
}

Assistant:

void btDbvtBroadphase::performDeferredRemoval(btDispatcher* dispatcher)
{

	if (m_paircache->hasDeferredRemoval())
	{

		btBroadphasePairArray&	overlappingPairArray = m_paircache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		int invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				//important to perform AABB check that is consistent with the broadphase
				btDbvtProxy*		pa=(btDbvtProxy*)pair.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)pair.m_pProxy1;
				bool hasOverlap = Intersect(pa->leaf->volume,pb->leaf->volume);

				if (hasOverlap)
				{
					needsRemoval = false;
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_paircache->cleanOverlappingPair(pair,dispatcher);

				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				invalidPair++;
			} 
			
		}

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());
		overlappingPairArray.resize(overlappingPairArray.size() - invalidPair);
	}
}